

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c++
# Opt level: O3

ArrayPtr<const_unsigned_char> __thiscall
kj::BufferedInputStream::getReadBuffer(BufferedInputStream *this)

{
  undefined4 extraout_var;
  size_t extraout_RDX;
  ArrayPtr<const_unsigned_char> AVar1;
  Fault f;
  Fault local_10;
  
  AVar1.ptr._0_4_ = (*(this->super_InputStream)._vptr_InputStream[4])();
  AVar1.ptr._4_4_ = extraout_var;
  if (extraout_RDX != 0) {
    AVar1.size_ = extraout_RDX;
    return AVar1;
  }
  _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[14]>
            (&local_10,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/io.c++"
             ,0x75,FAILED,"result.size() > 0","\"Premature EOF\"",(char (*) [14])"Premature EOF");
  _::Debug::Fault::fatal(&local_10);
}

Assistant:

ArrayPtr<const byte> BufferedInputStream::getReadBuffer() {
  auto result = tryGetReadBuffer();
  KJ_REQUIRE(result.size() > 0, "Premature EOF");
  return result;
}